

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# size.h
# Opt level: O2

Image<float,_gimage::PixelTraits<float>_> *
gimage::medianDownscaleImage<float>
          (Image<float,_gimage::PixelTraits<float>_> *__return_storage_ptr__,
          Image<float,_gimage::PixelTraits<float>_> *image,int factor)

{
  long k;
  bool bVar1;
  ulong uVar2;
  int d;
  ulong uVar3;
  long lVar4;
  uint uVar5;
  ulong uVar6;
  ulong uVar7;
  allocator_type local_79;
  ulong local_78;
  Image<float,_gimage::PixelTraits<float>_> *local_70;
  ulong local_68;
  ulong local_60;
  ulong local_58;
  vector<float,_std::allocator<float>_> v;
  value_type_conflict2 local_34;
  
  uVar3 = 1;
  if (1 < factor) {
    uVar3 = (ulong)(uint)factor;
  }
  local_70 = __return_storage_ptr__;
  Image<float,_gimage::PixelTraits<float>_>::Image
            (__return_storage_ptr__,(long)(image->width + (uVar3 - 1)) / (long)uVar3,
             (long)((uVar3 - 1) + image->height) / (long)uVar3,image->depth);
  local_34 = 0.0;
  local_78 = uVar3;
  std::vector<float,_std::allocator<float>_>::vector
            (&v,(ulong)(uint)((int)uVar3 * (int)uVar3),&local_34,&local_79);
  for (lVar4 = 0; lVar4 < image->depth; lVar4 = lVar4 + 1) {
    uVar3 = 0;
    while ((long)uVar3 < image->height) {
      uVar2 = 0;
      local_68 = uVar3;
      while ((long)uVar2 < image->width) {
        uVar6 = 0;
        uVar3 = 0;
        local_60 = uVar2;
        while ((uVar3 != local_78 &&
               (k = local_68 + uVar3, uVar2 = local_60, uVar7 = local_78, k < image->height))) {
          for (; (local_58 = uVar3, uVar7 != 0 && ((long)uVar2 < image->width)); uVar2 = uVar2 + 1)
          {
            bVar1 = Image<float,_gimage::PixelTraits<float>_>::isValid(image,uVar2,k);
            if (bVar1) {
              v.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
              _M_start[(int)uVar6] = image->img[lVar4][k][uVar2];
              uVar6 = (ulong)((int)uVar6 + 1);
            }
            uVar7 = uVar7 - 1;
            uVar3 = local_58;
          }
          uVar3 = local_58 + 1;
        }
        uVar3 = local_60 / local_78;
        uVar2 = local_68 / local_78;
        local_70->img[lVar4][uVar2][uVar3] = INFINITY;
        if (0 < (int)(uint)uVar6) {
          uVar5 = (uint)uVar6 >> 1;
          std::
          __partial_sort<__gnu_cxx::__normal_iterator<float*,std::vector<float,std::allocator<float>>>,__gnu_cxx::__ops::_Iter_less_iter>
                    (v.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                     super__Vector_impl_data._M_start,
                     v.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                     super__Vector_impl_data._M_start + uVar5,
                     v.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                     super__Vector_impl_data._M_start + uVar6);
          local_70->img[lVar4][uVar2][uVar3] =
               v.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
               _M_start[uVar5];
        }
        uVar2 = local_60 + local_78;
      }
      uVar3 = local_68 + local_78;
    }
  }
  std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
            (&v.super__Vector_base<float,_std::allocator<float>_>);
  return local_70;
}

Assistant:

Image<T> medianDownscaleImage(const Image<T> &image, int factor)
{
  factor=std::max(1, factor);

  Image<T> ret((image.getWidth()+factor-1)/factor,
               (image.getHeight()+factor-1)/factor, image.getDepth());

  std::vector<T> v(factor*factor, 0);

  for (int d=0; d<image.getDepth(); d++)
  {
    for (long k=0; k<image.getHeight(); k+=factor)
    {
      for (long i=0; i<image.getWidth(); i+=factor)
      {
        int n=0;

        for (int kk=0; kk<factor && k+kk<image.getHeight(); kk++)
        {
          for (int ii=0; ii<factor && i+ii<image.getWidth(); ii++)
          {
            if (image.isValid(i+ii, k+kk))
            {
              v[n]=image.get(i+ii, k+kk, d);
              n++;
            }
          }
        }

        ret.setInvalid(i/factor, k/factor, d);

        if (n > 0)
        {
          partial_sort(v.begin(), v.begin()+(n>>1), v.begin()+n);
          ret.set(i/factor, k/factor, d, v[n>>1]);
        }
      }
    }
  }

  return ret;
}